

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLin>
               *this,GetterXsYs<double> *getter1,GetterXsYs<double> *getter2,
              TransformerLogLin *transformer,ImU32 col)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  GetterXsYs<double> *pGVar5;
  TransformerLogLin *pTVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  long lVar13;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar3 = getter1->Count;
  iVar12 = getter2->Count;
  if (iVar3 < getter2->Count) {
    iVar12 = iVar3;
  }
  this->Prims = iVar12 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar11 = GImPlot;
  (this->P12).y = 0.0;
  lVar13 = (long)((getter1->Offset % iVar3 + iVar3) % iVar3) * (long)getter1->Stride;
  dVar1 = *(double *)((long)getter1->Ys + lVar13);
  dVar9 = log10(*(double *)((long)getter1->Xs + lVar13) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar11->CurrentPlot;
  dVar10 = (pIVar4->XAxis).Range.Min;
  iVar3 = transformer->YAxis;
  IVar2 = pIVar11->PixelRange[iVar3].Min;
  IVar7.y = (float)(pIVar11->My[iVar3] * (dVar1 - pIVar4->YAxis[iVar3].Range.Min) + (double)IVar2.y)
  ;
  IVar7.x = (float)(pIVar11->Mx *
                    (((double)(float)(dVar9 / pIVar11->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar10) + dVar10) - dVar10) + (double)IVar2.x);
  this->P11 = IVar7;
  pIVar11 = GImPlot;
  pGVar5 = this->Getter2;
  pTVar6 = this->Transformer;
  iVar3 = pGVar5->Count;
  lVar13 = (long)((pGVar5->Offset % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride;
  dVar1 = *(double *)((long)pGVar5->Ys + lVar13);
  dVar9 = log10(*(double *)((long)pGVar5->Xs + lVar13) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar11->CurrentPlot;
  dVar10 = (pIVar4->XAxis).Range.Min;
  iVar3 = pTVar6->YAxis;
  IVar2 = pIVar11->PixelRange[iVar3].Min;
  IVar8.y = (float)(pIVar11->My[iVar3] * (dVar1 - pIVar4->YAxis[iVar3].Range.Min) + (double)IVar2.y)
  ;
  IVar8.x = (float)(pIVar11->Mx *
                    (((double)(float)(dVar9 / pIVar11->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar10) + dVar10) - dVar10) + (double)IVar2.x);
  this->P12 = IVar8;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }